

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(cmGeneratorExpressionDAGChecker *this)

{
  int iVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = (this->Property)._M_dataplus._M_p;
  local_18._M_len = (this->Property)._M_string_length;
  __str._M_str = "TARGET_GENEX_EVAL:";
  __str._M_len = 0x12;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_18,0,0x12,__str);
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else {
    local_18._M_str = (this->Property)._M_dataplus._M_p;
    local_18._M_len = (this->Property)._M_string_length;
    __str_00._M_str = "GENEX_EVAL:";
    __str_00._M_len = 0xb;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_18,0,0xb,__str_00)
    ;
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression() const
{
  return cmHasLiteralPrefix(this->Property, "TARGET_GENEX_EVAL:") ||
    cmHasLiteralPrefix(this->Property, "GENEX_EVAL:");
}